

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O1

void Lf_ManSetFlowRefs(Gia_Man_t *p,Vec_Flt_t *vRefs,Vec_Int_t *vOffsets)

{
  float *pfVar1;
  undefined8 uVar2;
  uint *puVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  int iVar6;
  float *pfVar7;
  Gia_Obj_t *pGVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  float fVar17;
  Gia_Obj_t *pData1;
  Gia_Obj_t *pData0;
  Gia_Obj_t *local_40;
  Gia_Obj_t *local_38;
  
  uVar11 = (~(p->vCos->nSize + p->vCis->nSize) + p->nObjs) - p->nBufs;
  if (vRefs->nCap < (int)uVar11) {
    if (vRefs->pArray == (float *)0x0) {
      pfVar7 = (float *)malloc((long)(int)uVar11 << 2);
    }
    else {
      pfVar7 = (float *)realloc(vRefs->pArray,(long)(int)uVar11 << 2);
    }
    vRefs->pArray = pfVar7;
    vRefs->nCap = uVar11;
  }
  if (0 < (int)uVar11) {
    memset(vRefs->pArray,0,(ulong)uVar11 << 2);
  }
  vRefs->nSize = uVar11;
  uVar11 = p->nObjs;
  uVar13 = (ulong)uVar11;
  if (0 < (int)uVar11) {
    lVar15 = 0;
    lVar16 = 0;
    do {
      uVar11 = (uint)uVar13;
      pGVar8 = p->pObjs;
      if (pGVar8 == (Gia_Obj_t *)0x0) break;
      pGVar4 = (Gia_Obj_t *)(&pGVar8->field_0x0 + lVar15);
      uVar9 = (uint)*(ulong *)pGVar4;
      uVar13 = *(ulong *)pGVar4 & 0x1fffffff;
      if (uVar13 != 0x1fffffff && -1 < (int)uVar9) {
        uVar2 = *(undefined8 *)((long)pGVar8 + lVar15 + (ulong)(uint)((int)uVar13 << 2) * -3);
        uVar12 = (uint)uVar2;
        if (((~uVar12 & 0x1fffffff) != 0 && -1 < (int)uVar12) &&
           ((((uint)((ulong)uVar2 >> 0x20) ^ uVar12) & 0x1fffffff) != 0)) {
          uVar13 = (ulong)-(uVar9 & 0x1fffffff) + lVar16;
          iVar6 = (int)uVar13;
          if ((iVar6 < 0) || (vOffsets->nSize <= iVar6)) goto LAB_007604a0;
          lVar10 = (long)vOffsets->pArray[uVar13 & 0xffffffff];
          if ((lVar10 < 0) || (vRefs->nSize <= vOffsets->pArray[uVar13 & 0xffffffff]))
          goto LAB_00760481;
          vRefs->pArray[lVar10] = vRefs->pArray[lVar10] + 1.0;
        }
        uVar12 = (uint)((ulong)*(undefined8 *)pGVar4 >> 0x20);
        uVar9 = uVar12 & 0x1fffffff;
        uVar14 = (uint)*(undefined8 *)pGVar4;
        if ((((int)uVar14 < 0) || (uVar14 = uVar14 & 0x1fffffff, uVar14 == 0x1fffffff)) ||
           (uVar14 != uVar9)) {
          uVar2 = *(undefined8 *)((long)pGVar8 + lVar15 + (ulong)((uVar12 & 0x1fffffff) << 2) * -3);
          uVar12 = (uint)uVar2;
          if (((~uVar12 & 0x1fffffff) != 0 && -1 < (int)uVar12) &&
             ((((uint)((ulong)uVar2 >> 0x20) ^ uVar12) & 0x1fffffff) != 0)) {
            uVar13 = (ulong)-uVar9 + lVar16;
            iVar6 = (int)uVar13;
            if ((iVar6 < 0) || (vOffsets->nSize <= iVar6)) goto LAB_007604a0;
            lVar10 = (long)vOffsets->pArray[uVar13 & 0xffffffff];
            if ((lVar10 < 0) || (vRefs->nSize <= vOffsets->pArray[uVar13 & 0xffffffff]))
            goto LAB_00760481;
            vRefs->pArray[lVar10] = vRefs->pArray[lVar10] + 1.0;
          }
          puVar3 = p->pMuxes;
          if (puVar3 == (uint *)0x0) {
            iVar6 = Gia_ObjIsMuxType(pGVar4);
            if (iVar6 != 0) {
              pGVar8 = Gia_ObjRecognizeMux(pGVar4,&local_40,&local_38);
              pGVar8 = (Gia_Obj_t *)((ulong)pGVar8 & 0xfffffffffffffffe);
              local_38 = (Gia_Obj_t *)((ulong)local_38 & 0xfffffffffffffffe);
              local_40 = (Gia_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe);
              uVar11 = (uint)*(undefined8 *)pGVar8;
              if (((~uVar11 & 0x1fffffff) != 0 && -1 < (int)uVar11) &&
                 ((((uint)((ulong)*(undefined8 *)pGVar8 >> 0x20) ^ uVar11) & 0x1fffffff) != 0)) {
                pGVar4 = p->pObjs;
                if ((pGVar8 < pGVar4) || (pGVar4 + p->nObjs <= pGVar8)) goto LAB_007604bf;
                uVar11 = (int)((long)pGVar8 - (long)pGVar4 >> 2) * -0x55555555;
                if (((int)uVar11 < 0) || (vOffsets->nSize <= (int)uVar11)) goto LAB_007604a0;
                lVar10 = (long)vOffsets->pArray[uVar11 & 0x7fffffff];
                if ((lVar10 < 0) || (vRefs->nSize <= vOffsets->pArray[uVar11 & 0x7fffffff]))
                goto LAB_00760481;
                vRefs->pArray[lVar10] = vRefs->pArray[lVar10] + -1.0;
              }
              if (local_38 == local_40) {
                uVar11 = (uint)*(undefined8 *)local_38;
                if (((~uVar11 & 0x1fffffff) != 0 && -1 < (int)uVar11) &&
                   ((((uint)((ulong)*(undefined8 *)local_38 >> 0x20) ^ uVar11) & 0x1fffffff) != 0))
                {
                  pGVar8 = p->pObjs;
                  if ((local_38 < pGVar8) || (pGVar8 + p->nObjs <= local_38)) goto LAB_007604bf;
                  uVar11 = (int)((long)local_38 - (long)pGVar8 >> 2) * -0x55555555;
                  if (((int)uVar11 < 0) || (vOffsets->nSize <= (int)uVar11)) goto LAB_007604a0;
                  uVar11 = vOffsets->pArray[uVar11 & 0x7fffffff];
                  if ((int)uVar11 < 0) goto LAB_00760481;
                  fVar17 = -1.0;
LAB_00760333:
                  if (vRefs->nSize <= (int)uVar11) goto LAB_00760481;
                  vRefs->pArray[uVar11] = fVar17 + vRefs->pArray[uVar11];
                }
              }
            }
          }
          else if (puVar3[lVar16] != 0) {
            if ((int)uVar11 <= lVar16) {
LAB_007604bf:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            if ((int)puVar3[lVar16] < 0) {
LAB_007604de:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            uVar9 = puVar3[lVar16] >> 1;
            if ((int)uVar11 <= (int)uVar9) goto LAB_00760462;
            uVar11 = (uint)*(undefined8 *)(pGVar8 + uVar9);
            if (((~uVar11 & 0x1fffffff) != 0 && -1 < (int)uVar11) &&
               ((((uint)((ulong)*(undefined8 *)(pGVar8 + uVar9) >> 0x20) ^ uVar11) & 0x1fffffff) !=
                0)) {
              uVar11 = puVar3[lVar16];
              if (uVar11 == 0) {
                uVar11 = 0xffffffff;
              }
              else {
                if ((int)uVar11 < 0) goto LAB_007604de;
                uVar11 = uVar11 >> 1;
              }
              if ((-1 < (int)uVar11) && ((int)uVar11 < vOffsets->nSize)) {
                uVar11 = vOffsets->pArray[uVar11];
                if (-1 < (int)uVar11) {
                  fVar17 = 1.0;
                  goto LAB_00760333;
                }
                goto LAB_00760481;
              }
              goto LAB_007604a0;
            }
          }
        }
      }
      lVar16 = lVar16 + 1;
      uVar11 = p->nObjs;
      uVar13 = (ulong)(int)uVar11;
      lVar15 = lVar15 + 0xc;
    } while (lVar16 < (long)uVar13);
  }
  lVar15 = (long)p->vCos->nSize;
  if (0 < lVar15) {
    piVar5 = p->vCos->pArray;
    lVar16 = 0;
    do {
      iVar6 = piVar5[lVar16];
      if (((long)iVar6 < 0) || ((int)uVar11 <= iVar6)) {
LAB_00760462:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar9 = iVar6 - (*(uint *)(p->pObjs + iVar6) & 0x1fffffff);
      if (((int)uVar9 < 0) || ((int)uVar11 <= (int)uVar9)) goto LAB_00760462;
      uVar2 = *(undefined8 *)(p->pObjs + uVar9);
      uVar12 = (uint)uVar2;
      if (((~uVar12 & 0x1fffffff) != 0 && -1 < (int)uVar12) &&
         ((((uint)((ulong)uVar2 >> 0x20) ^ uVar12) & 0x1fffffff) != 0)) {
        if (vOffsets->nSize <= (int)uVar9) {
LAB_007604a0:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        lVar10 = (long)vOffsets->pArray[uVar9];
        if ((lVar10 < 0) || (vRefs->nSize <= vOffsets->pArray[uVar9])) {
LAB_00760481:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                        ,0x195,"void Vec_FltAddToEntry(Vec_Flt_t *, int, float)");
        }
        vRefs->pArray[lVar10] = vRefs->pArray[lVar10] + 1.0;
      }
      lVar16 = lVar16 + 1;
    } while (lVar15 != lVar16);
  }
  iVar6 = vRefs->nSize;
  if (0 < (long)iVar6) {
    pfVar7 = vRefs->pArray;
    lVar15 = 0;
    do {
      pfVar1 = pfVar7 + lVar15;
      if (*pfVar1 <= 1.0 && *pfVar1 != 1.0) {
        pfVar7[lVar15] = 1.0;
      }
      lVar15 = lVar15 + 1;
    } while (iVar6 != lVar15);
  }
  return;
}

Assistant:

void Lf_ManSetFlowRefs( Gia_Man_t * p, Vec_Flt_t * vRefs, Vec_Int_t * vOffsets )
{
    int fDiscount = 1;
    Gia_Obj_t * pObj, * pCtrl, * pData0, * pData1; 
    int i, Id;
    Vec_FltFill( vRefs, Gia_ManAndNotBufNum(p), 0 );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Gia_ObjIsAndNotBuf(Gia_ObjFanin0(pObj)) )
            Vec_FltAddToEntry( vRefs, Vec_IntEntry(vOffsets, Gia_ObjFaninId0(pObj, i)), 1 );
        if ( Gia_ObjIsBuf(pObj) )
            continue;
        if ( Gia_ObjIsAndNotBuf(Gia_ObjFanin1(pObj)) )
            Vec_FltAddToEntry( vRefs, Vec_IntEntry(vOffsets, Gia_ObjFaninId1(pObj, i)), 1 );
        if ( p->pMuxes )
        {
            if ( Gia_ObjIsMuxId(p, i) && Gia_ObjIsAndNotBuf(Gia_ObjFanin2(p, pObj)) )
                Vec_FltAddToEntry( vRefs, Vec_IntEntry(vOffsets, Gia_ObjFaninId2(p, i)), 1 );
        }
        else if ( fDiscount && Gia_ObjIsMuxType(pObj) ) // discount XOR/MUX
        {
            pCtrl  = Gia_Regular(Gia_ObjRecognizeMux(pObj, &pData1, &pData0));
            pData0 = Gia_Regular(pData0);
            pData1 = Gia_Regular(pData1);
            if ( Gia_ObjIsAndNotBuf(pCtrl) )
                Vec_FltAddToEntry( vRefs, Vec_IntEntry(vOffsets, Gia_ObjId(p, pCtrl)), -1 );
            if ( pData0 == pData1 && Gia_ObjIsAndNotBuf(pData0) )
                Vec_FltAddToEntry( vRefs, Vec_IntEntry(vOffsets, Gia_ObjId(p, pData0)), -1 );
        }
    }
    Gia_ManForEachCoDriverId( p, Id, i )
        if ( Gia_ObjIsAndNotBuf(Gia_ManObj(p, Id)) )
            Vec_FltAddToEntry( vRefs, Vec_IntEntry(vOffsets, Id), 1 );
    for ( i = 0; i < Vec_FltSize(vRefs); i++ )
        Vec_FltUpdateEntry( vRefs, i, 1 );
}